

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O1

void __thiscall depspawn::internal::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer ptVar1;
  _Manager_type p_Var2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  thread *thread;
  pointer ptVar3;
  
  do {
    do {
    } while (this->ready_ != false);
  } while (this->count_ != 0);
  this->finish_ = true;
  launch_theads(this);
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  p_Var2 = (this->func_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->func_,(_Any_data *)&this->func_,__destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->cond_var_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool()
  {
    wait();
    
    finish_ = true;
    launch_theads();
    for (auto& thread : threads_) {
      thread.join();
    }
  }